

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O3

int __thiscall
QAbstractSocketPrivate::bind(QAbstractSocketPrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  QObject *pQVar1;
  QHostAddressPrivate *pQVar2;
  long *plVar3;
  char cVar4;
  bool bVar5;
  quint16 qVar6;
  NetworkLayerProtocol protocol;
  undefined4 uVar7;
  SocketError errorCode;
  qintptr qVar8;
  int iVar9;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QHostAddress nullAddress;
  QHostAddress local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if (this->socketEngine == (QAbstractSocketEngine *)0x0) {
LAB_001c0486:
    local_60.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QHostAddress::QHostAddress(&local_60);
    QHostAddress::toString(&local_58,&local_60);
    resolveProxy(this,&local_58,(quint16)__addr);
    if ((QHostAddressPrivate *)local_58.d.d != (QHostAddressPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    protocol = QHostAddress::protocol((QHostAddress *)CONCAT44(in_register_00000034,__fd));
    if (protocol == UnknownNetworkLayerProtocol) {
      protocol = QHostAddress::protocol(&local_60);
    }
    bVar5 = initSocketLayer(this,protocol);
    QHostAddress::~QHostAddress(&local_60);
    if (bVar5) goto LAB_001c0516;
  }
  else {
    cVar4 = (**(code **)(*(long *)this->socketEngine + 0x78))();
    if (cVar4 == '\0') goto LAB_001c0486;
LAB_001c0516:
    if (__len != 0) {
      (**(code **)(*(long *)this->socketEngine + 0x118))(this->socketEngine,4,(__len & 5) != 0);
    }
    uVar7 = (**(code **)(*(long *)this->socketEngine + 0x90))
                      (this->socketEngine,(QHostAddress *)CONCAT44(in_register_00000034,__fd),
                       (ulong)__addr & 0xffff);
    qVar8 = (**(code **)(*(long *)this->socketEngine + 0x70))();
    this->cachedSocketDescriptor = qVar8;
    if ((char)uVar7 != '\0') {
      this->state = BoundState;
      QAbstractSocketEngine::localAddress((QAbstractSocketEngine *)&local_58);
      pQVar2 = (this->localAddress).d.d.ptr;
      (this->localAddress).d.d.ptr = (QHostAddressPrivate *)local_58.d.d;
      local_58.d.d = (Data *)pQVar2;
      QHostAddress::~QHostAddress((QHostAddress *)&local_58);
      qVar6 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)this->socketEngine);
      this->localPort = qVar6;
      local_58.d.ptr = (char16_t *)&local_60;
      local_60.d.d.ptr._0_4_ = this->state;
      local_58.d.d = (Data *)0x0;
      QMetaObject::activate(pQVar1,&QAbstractSocket::staticMetaObject,3,(void **)&local_58);
      plVar3 = *(long **)(*(long *)(pQVar1 + 8) + 0x208);
      if (plVar3 == (long *)0x0) {
        cVar4 = QIODevice::isOpen();
      }
      else {
        cVar4 = (**(code **)(*plVar3 + 0x78))();
      }
      iVar9 = (int)CONCAT71((uint7)(uint3)((uint)uVar7 >> 8),1);
      if ((cVar4 != '\0') && (this->socketType == UdpSocket)) {
        (**(code **)(*(long *)this->socketEngine + 0x140))(this->socketEngine,1);
      }
      goto LAB_001c0659;
    }
    errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
    QAbstractSocketEngine::errorString(&local_58,(QAbstractSocketEngine *)this->socketEngine);
    setErrorAndEmit(this,errorCode,&local_58);
    if ((QHostAddressPrivate *)local_58.d.d != (QHostAddressPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  iVar9 = 0;
LAB_001c0659:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractSocketPrivate::bind(const QHostAddress &address, quint16 port, QAbstractSocket::BindMode mode)
{
    Q_Q(QAbstractSocket);

    // now check if the socket engine is initialized and to the right type
    if (!socketEngine || !socketEngine->isValid()) {
        QHostAddress nullAddress;
        resolveProxy(nullAddress.toString(), port);

        QAbstractSocket::NetworkLayerProtocol protocol = address.protocol();
        if (protocol == QAbstractSocket::UnknownNetworkLayerProtocol)
            protocol = nullAddress.protocol();

        if (!initSocketLayer(protocol))
            return false;
    }

    if (mode != QAbstractSocket::DefaultForPlatform) {
#ifdef Q_OS_UNIX
    if ((mode & QAbstractSocket::ShareAddress) || (mode & QAbstractSocket::ReuseAddressHint))
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 0);
#endif
#ifdef Q_OS_WIN
    if (mode & QAbstractSocket::ReuseAddressHint)
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 0);
    if (mode & QAbstractSocket::DontShareAddress)
        socketEngine->setOption(QAbstractSocketEngine::BindExclusively, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::BindExclusively, 0);
#endif
    }
    bool result = socketEngine->bind(address, port);
    cachedSocketDescriptor = socketEngine->socketDescriptor();

    if (!result) {
        setErrorAndEmit(socketEngine->error(), socketEngine->errorString());
        return false;
    }

    state = QAbstractSocket::BoundState;
    localAddress = socketEngine->localAddress();
    localPort = socketEngine->localPort();

    emit q->stateChanged(state);
    // A slot attached to stateChanged() signal can break our invariant:
    // by closing the socket it will reset its socket engine - thus we
    // have additional check (isValid()) ...
    if (q->isValid() && socketType == QAbstractSocket::UdpSocket)
        socketEngine->setReadNotificationEnabled(true);
    return true;
}